

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void DrawTexturePoly(Texture2D texture,Vector2 center,Vector2 *points,Vector2 *texcoords,
                    int pointsCount,Color tint)

{
  int local_30;
  int i;
  int pointsCount_local;
  Vector2 *texcoords_local;
  Vector2 *points_local;
  float fStack_10;
  Color tint_local;
  Vector2 center_local;
  
  rlCheckRenderBatchLimit((pointsCount + -1) * 4);
  rlSetTexture(texture.id);
  rlBegin(7);
  points_local._4_1_ = tint.r;
  points_local._5_1_ = tint.g;
  points_local._6_1_ = tint.b;
  points_local._7_1_ = tint.a;
  rlColor4ub(points_local._4_1_,points_local._5_1_,points_local._6_1_,points_local._7_1_);
  for (local_30 = 0; local_30 < pointsCount + -1; local_30 = local_30 + 1) {
    rlTexCoord2f(0.5,0.5);
    fStack_10 = center.x;
    tint_local = (Color)center.y;
    rlVertex2f(fStack_10,(float)tint_local);
    rlTexCoord2f(texcoords[local_30].x,texcoords[local_30].y);
    rlVertex2f(points[local_30].x + fStack_10,points[local_30].y + (float)tint_local);
    rlTexCoord2f(texcoords[local_30 + 1].x,texcoords[local_30 + 1].y);
    rlVertex2f(points[local_30 + 1].x + fStack_10,points[local_30 + 1].y + (float)tint_local);
    rlTexCoord2f(texcoords[local_30 + 1].x,texcoords[local_30 + 1].y);
    rlVertex2f(points[local_30 + 1].x + fStack_10,points[local_30 + 1].y + (float)tint_local);
  }
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawTexturePoly(Texture2D texture, Vector2 center, Vector2 *points, Vector2 *texcoords, int pointsCount, Color tint)
{
    rlCheckRenderBatchLimit((pointsCount - 1)*4);

    rlSetTexture(texture.id);

    // Texturing is only supported on QUADs
    rlBegin(RL_QUADS);

        rlColor4ub(tint.r, tint.g, tint.b, tint.a);

        for (int i = 0; i < pointsCount - 1; i++)
        {
            rlTexCoord2f(0.5f, 0.5f);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f(texcoords[i].x, texcoords[i].y);
            rlVertex2f(points[i].x + center.x, points[i].y + center.y);

            rlTexCoord2f(texcoords[i + 1].x, texcoords[i + 1].y);
            rlVertex2f(points[i + 1].x + center.x, points[i + 1].y + center.y);

            rlTexCoord2f(texcoords[i + 1].x, texcoords[i + 1].y);
            rlVertex2f(points[i + 1].x + center.x, points[i + 1].y + center.y);
        }
    rlEnd();

    rlSetTexture(0);
}